

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

ON_SimpleArray<const_ON_SubDFace_*> * __thiscall
ON_SimpleArray<const_ON_SubDFace_*>::operator=
          (ON_SimpleArray<const_ON_SubDFace_*> *this,ON_SimpleArray<const_ON_SubDFace_*> *src)

{
  ON_SimpleArray<const_ON_SubDFace_*> *src_local;
  ON_SimpleArray<const_ON_SubDFace_*> *this_local;
  
  if (this != src) {
    if (src->m_count < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < src->m_count) {
        SetCapacity(this,(long)src->m_count);
      }
      if (this->m_a != (ON_SubDFace **)0x0) {
        this->m_count = src->m_count;
        memcpy(this->m_a,src->m_a,(long)this->m_count << 3);
      }
    }
  }
  return this;
}

Assistant:

ON_SimpleArray<T>& ON_SimpleArray<T>::operator=( const ON_SimpleArray<T>& src )
{
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        memcpy( (void*)(m_a), (void*)(src.m_a), m_count*sizeof(T) );
      }
    }
  }  
  return *this;
}